

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>::
     occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  vbool<4> vVar10;
  char cVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  undefined4 uVar15;
  uint uVar16;
  ulong uVar17;
  RayQueryContext *pRVar18;
  RayQueryContext *extraout_RDX;
  NodeRef root;
  size_t sVar19;
  size_t sVar20;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar21;
  ulong uVar22;
  NodeRef *pNVar23;
  int iVar24;
  float fVar25;
  float fVar26;
  float fVar46;
  float fVar47;
  vint4 bi;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar48;
  float fVar52;
  float fVar53;
  undefined1 auVar49 [16];
  float fVar54;
  undefined1 auVar50 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar51;
  float fVar55;
  float fVar59;
  float fVar60;
  vint4 ai_3;
  float fVar61;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar58;
  float fVar62;
  float fVar65;
  float fVar66;
  vint4 ai_1;
  float fVar67;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vint4 ai;
  undefined1 auVar68 [16];
  float fVar69;
  vint4 bi_2;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar73;
  uint uVar74;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  uint uVar80;
  vint4 ai_2;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint uVar81;
  uint uVar82;
  float fVar83;
  vfloat4 a0;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar91;
  float fVar92;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar93;
  float fVar96;
  float fVar97;
  vint4 bi_3;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar98;
  float fVar99;
  uint uVar100;
  float fVar105;
  uint uVar106;
  float fVar107;
  uint uVar108;
  vint4 bi_1;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar103;
  undefined1 auVar104 [16];
  float fVar109;
  uint uVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  uint uVar114;
  uint uVar115;
  undefined1 in_XMM15 [16];
  uint uVar116;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar9 = mm_lookupmask_ps._8_8_;
  uVar8 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar20 = (bvh->root).ptr;
  if (sVar20 != 8) {
    auVar70 = *(undefined1 (*) [16])(ray + 0x80);
    auVar63._0_12_ = ZEXT812(0);
    auVar63._12_4_ = 0;
    auVar49._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar70._0_4_);
    auVar49._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar70._4_4_);
    auVar49._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar70._8_4_);
    auVar49._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar70._12_4_);
    uVar16 = movmskps((int)context,auVar49);
    if (uVar16 != 0) {
      uVar17 = (ulong)(uVar16 & 0xff);
      pRVar18 = (RayQueryContext *)pre.ray_space;
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      fVar62 = tray.dir.field_0._0_4_;
      fVar65 = tray.dir.field_0._4_4_;
      fVar66 = tray.dir.field_0._8_4_;
      fVar67 = tray.dir.field_0._12_4_;
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      fVar55 = tray.dir.field_0._16_4_;
      fVar59 = tray.dir.field_0._20_4_;
      fVar60 = tray.dir.field_0._24_4_;
      fVar61 = tray.dir.field_0._28_4_;
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar48 = tray.dir.field_0._32_4_;
      fVar52 = tray.dir.field_0._36_4_;
      fVar53 = tray.dir.field_0._40_4_;
      fVar54 = tray.dir.field_0._44_4_;
      auVar75._0_4_ = fVar55 * fVar55 + fVar48 * fVar48;
      auVar75._4_4_ = fVar59 * fVar59 + fVar52 * fVar52;
      auVar75._8_4_ = fVar60 * fVar60 + fVar53 * fVar53;
      auVar75._12_4_ = fVar61 * fVar61 + fVar54 * fVar54;
      auVar84._0_4_ = fVar62 * fVar62 + auVar75._0_4_;
      auVar84._4_4_ = fVar65 * fVar65 + auVar75._4_4_;
      auVar84._8_4_ = fVar66 * fVar66 + auVar75._8_4_;
      auVar84._12_4_ = fVar67 * fVar67 + auVar75._12_4_;
      auVar75 = rsqrtps(auVar75,auVar84);
      fVar83 = auVar75._0_4_;
      fVar25 = auVar75._4_4_;
      fVar26 = auVar75._8_4_;
      fVar46 = auVar75._12_4_;
      pre.depth_scale.field_0.v[0] = fVar83 * fVar83 * auVar84._0_4_ * -0.5 * fVar83 + fVar83 * 1.5;
      pre.depth_scale.field_0.v[1] = fVar25 * fVar25 * auVar84._4_4_ * -0.5 * fVar25 + fVar25 * 1.5;
      pre.depth_scale.field_0.v[2] = fVar26 * fVar26 * auVar84._8_4_ * -0.5 * fVar26 + fVar26 * 1.5;
      pre.depth_scale.field_0.v[3] = fVar46 * fVar46 * auVar84._12_4_ * -0.5 * fVar46 + fVar46 * 1.5
      ;
      do {
        lVar4 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        auVar84 = insertps(ZEXT416(*(uint *)(ray + lVar4 * 4 + 0x40)),
                           *(undefined4 *)(ray + lVar4 * 4 + 0x50),0x1c);
        auVar84 = insertps(auVar84,*(undefined4 *)(ray + lVar4 * 4 + 0x60),0x28);
        fVar83 = *(float *)((long)pre.ray_space + lVar4 * 4 + -0x10);
        auVar85._0_4_ = auVar84._0_4_ * fVar83;
        auVar85._4_4_ = auVar84._4_4_ * fVar83;
        auVar85._8_4_ = auVar84._8_4_ * fVar83;
        auVar85._12_4_ = auVar84._12_4_ * fVar83;
        uVar22 = CONCAT44(auVar85._4_4_,auVar85._4_4_);
        auVar27._0_8_ = uVar22 ^ 0x8000000080000000;
        auVar27._8_4_ = -auVar85._12_4_;
        auVar27._12_4_ = -auVar85._12_4_;
        auVar84 = blendps(auVar27,auVar63,0xe);
        auVar102._4_4_ = auVar84._0_4_;
        auVar102._0_4_ = auVar85._8_4_;
        auVar102._8_4_ = auVar84._4_4_;
        auVar102._12_4_ = 0;
        auVar101._4_4_ = auVar84._0_4_;
        auVar101._0_4_ = auVar85._8_4_;
        auVar101._8_4_ = auVar84._4_4_;
        auVar101._12_4_ = 0;
        auVar101 = dpps(auVar101 << 0x20,auVar102 << 0x20,0x7f);
        uVar22 = CONCAT44(auVar85._12_4_,auVar85._8_4_);
        auVar89._0_8_ = uVar22 ^ 0x8000000080000000;
        auVar89._8_4_ = -auVar85._8_4_;
        auVar89._12_4_ = -auVar85._12_4_;
        auVar75 = insertps(auVar89,auVar85,0x2a);
        auVar84 = dpps(auVar75,auVar75,0x7f);
        iVar24 = -(uint)(auVar84._0_4_ < auVar101._0_4_);
        auVar28._4_4_ = iVar24;
        auVar28._0_4_ = iVar24;
        auVar28._8_4_ = iVar24;
        auVar28._12_4_ = iVar24;
        auVar84 = blendvps(auVar75,auVar102 << 0x20,auVar28);
        auVar75 = dpps(auVar84,auVar84,0x7f);
        auVar102 = rsqrtss(auVar75,auVar75);
        fVar25 = auVar102._0_4_;
        fVar25 = fVar25 * 1.5 - fVar25 * fVar25 * auVar75._0_4_ * 0.5 * fVar25;
        fVar26 = fVar25 * auVar84._0_4_;
        fVar46 = fVar25 * auVar84._4_4_;
        fVar47 = fVar25 * auVar84._8_4_;
        fVar25 = fVar25 * auVar84._12_4_;
        fVar88 = fVar46 * auVar85._0_4_ - auVar85._4_4_ * fVar26;
        fVar91 = fVar47 * auVar85._4_4_ - auVar85._8_4_ * fVar46;
        fVar92 = fVar26 * auVar85._8_4_ - auVar85._0_4_ * fVar47;
        auVar90._12_4_ = fVar25 * auVar85._12_4_ - auVar85._12_4_ * fVar25;
        auVar90._0_8_ = CONCAT44(fVar92,fVar91);
        auVar90._8_4_ = fVar88;
        auVar94._8_4_ = fVar88;
        auVar94._0_8_ = auVar90._0_8_;
        auVar94._12_4_ = auVar90._12_4_;
        auVar84 = dpps(auVar94,auVar90,0x7f);
        auVar75 = rsqrtss(auVar84,auVar84);
        fVar25 = auVar75._0_4_;
        fVar25 = fVar25 * 1.5 - fVar25 * fVar25 * auVar84._0_4_ * 0.5 * fVar25;
        aVar29.m128[1] = fVar25 * fVar88;
        aVar29.m128[0] = fVar47;
        aVar29.m128[2] = auVar85._8_4_ * fVar83;
        aVar29.m128[3] = 0.0;
        (((LinearSpace3fa *)((long)pRVar18 + lVar4 * 0x30))->vx).field_0.m128[0] = fVar26;
        pre.ray_space[lVar4].vx.field_0.m128[1] = fVar25 * fVar91;
        pre.ray_space[lVar4].vx.field_0.m128[2] = auVar85._0_4_ * fVar83;
        pre.ray_space[lVar4].vx.field_0.m128[3] = 0.0;
        aVar7.m128[1] = fVar25 * fVar92;
        aVar7.m128[0] = fVar46;
        aVar7.m128[2] = auVar85._4_4_ * fVar83;
        aVar7.m128[3] = 0.0;
        pre.ray_space[lVar4].vy.field_0 = aVar7;
        pre.ray_space[lVar4].vz.field_0 = aVar29;
        uVar17 = uVar17 & uVar17 - 1;
      } while (uVar17 != 0);
      tray.org.field_0._0_4_ = (undefined4)*(undefined8 *)ray;
      tray.org.field_0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      tray.org.field_0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      tray.org.field_0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      fVar83 = (float)DAT_01f80d30;
      fVar25 = DAT_01f80d30._4_4_;
      fVar26 = DAT_01f80d30._8_4_;
      fVar46 = DAT_01f80d30._12_4_;
      auVar30._4_4_ = -(uint)(ABS(fVar65) < fVar25);
      auVar30._0_4_ = -(uint)(ABS(fVar62) < fVar83);
      auVar30._8_4_ = -(uint)(ABS(fVar66) < fVar26);
      auVar30._12_4_ = -(uint)(ABS(fVar67) < fVar46);
      auVar75 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar84 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar31._4_4_ = -(uint)(ABS(fVar59) < fVar25);
      auVar31._0_4_ = -(uint)(ABS(fVar55) < fVar83);
      auVar63 = divps(_DAT_01f7ba10,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar32._4_4_ = -(uint)(ABS(fVar52) < fVar25);
      auVar32._0_4_ = -(uint)(ABS(fVar48) < fVar83);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar75,_DAT_01fab950,auVar30);
      auVar31._8_4_ = -(uint)(ABS(fVar60) < fVar26);
      auVar31._12_4_ = -(uint)(ABS(fVar61) < fVar46);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar84,_DAT_01fab950,auVar31);
      auVar32._8_4_ = -(uint)(ABS(fVar53) < fVar26);
      auVar32._12_4_ = -(uint)(ABS(fVar54) < fVar46);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar63,_DAT_01fab950,auVar32);
      auVar50._0_12_ = ZEXT812(0);
      auVar50._12_4_ = 0;
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)(tray.rdir.field_0._4_4_ < 0.0),-(uint)(tray.rdir.field_0._0_4_ < 0.0)) &
           0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar33._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar33._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar33._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar33._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeed0,_DAT_01f8c1f0,auVar33);
      auVar34._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar34._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar34._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar34._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01faeef0,_DAT_01faeee0,auVar34);
      auVar63 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar50);
      auVar70 = maxps(auVar70,auVar50);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f7a9f0,auVar63,auVar49);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f7aa00,auVar70,auVar49);
      auVar70._8_4_ = 0xffffffff;
      auVar70._0_8_ = 0xffffffffffffffff;
      auVar70._12_4_ = 0xffffffff;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar70 ^ auVar49);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar16 = 3;
      }
      else {
        uVar16 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar23 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar21 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = sVar20;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar13 = 0x21d2f80;
      auVar70 = pmovsxbd(in_XMM15,0x1010101);
      aVar51 = _DAT_01f7a9f0;
LAB_0023ee57:
      do {
        do {
          root.ptr = pNVar23[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0023f4ee;
          pNVar23 = pNVar23 + -1;
          paVar21 = paVar21 + -1;
          aVar58.v = *(__m128 *)paVar21->v;
          auVar35._4_4_ = -(uint)(aVar58.v[1] < tray.tfar.field_0.v[1]);
          auVar35._0_4_ = -(uint)(aVar58.v[0] < tray.tfar.field_0.v[0]);
          auVar35._8_4_ = -(uint)(aVar58.v[2] < tray.tfar.field_0.v[2]);
          auVar35._12_4_ = -(uint)(aVar58._12_4_ < tray.tfar.field_0.v[3]);
          uVar13 = movmskps(uVar13,auVar35);
        } while (uVar13 == 0);
        uVar17 = (ulong)(byte)uVar13;
        uVar14 = POPCOUNT(uVar13 & 0xff);
        uVar114 = uVar14;
        if (uVar16 < uVar14) {
LAB_0023ee95:
          do {
            vVar10.field_0 = terminated.field_0;
            uVar13 = 4;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0023f4ee;
              auVar44._4_4_ = -(uint)(aVar58.v[1] < tray.tfar.field_0.v[1]);
              auVar44._0_4_ = -(uint)(aVar58.v[0] < tray.tfar.field_0.v[0]);
              auVar44._8_4_ = -(uint)(aVar58.v[2] < tray.tfar.field_0.v[2]);
              auVar44._12_4_ = -(uint)(aVar58.v[3] < tray.tfar.field_0.v[3]);
              uVar13 = movmskps(uVar114,auVar44);
              if (uVar13 != 0) {
                bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                uVar17 = (ulong)bVar1;
                pvVar3 = This->leafIntersector;
                valid_o.field_0._8_8_ = uVar9;
                valid_o.field_0._0_8_ = uVar8;
                uVar13 = movmskps((int)pRVar18,(undefined1  [16])terminated.field_0);
                uVar13 = uVar13 ^ 0xf;
                pRVar18 = (RayQueryContext *)(ulong)uVar13;
                if (uVar13 != 0) {
                  uVar22 = (ulong)(byte)uVar13;
                  do {
                    lVar4 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                      }
                    }
                    cVar11 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x18))
                                       (&pre,ray,lVar4,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    if (cVar11 != '\0') {
                      valid_o.field_0.i[lVar4] = -1;
                    }
                    uVar17 = uVar22 - 1;
                    uVar22 = uVar22 & uVar17;
                  } while (uVar22 != 0);
                  auVar70 = pmovsxbd(auVar70,0x1010101);
                  pRVar18 = extraout_RDX;
                  aVar51 = _DAT_01f7a9f0;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])valid_o.field_0 | (undefined1  [16])vVar10.field_0);
                uVar13 = movmskps((int)uVar17,(undefined1  [16])terminated.field_0);
                if (uVar13 == 0xf) goto LAB_0023f4ee;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_0023ee57;
            }
            uVar17 = root.ptr & 0xfffffffffffffff0;
            pRVar18 = (RayQueryContext *)0x1c;
            sVar20 = 8;
            aVar103 = aVar51;
            do {
              sVar2 = *(size_t *)((uVar17 - 0xe0) + (long)pRVar18 * 8);
              sVar19 = sVar20;
              aVar58 = aVar51;
              if (sVar2 == 8) break;
              if ((root.ptr & 7) == 0) {
                fVar48 = *(float *)((root.ptr - 0x50) + (long)pRVar18 * 4);
                fVar52 = *(float *)((root.ptr - 0x40) + (long)pRVar18 * 4);
                fVar53 = *(float *)((root.ptr - 0x30) + (long)pRVar18 * 4);
                fVar54 = *(float *)((root.ptr - 0x20) + (long)pRVar18 * 4);
                auVar56._0_8_ =
                     CONCAT44((fVar48 - (float)tray.org.field_0._4_4_) *
                              (float)tray.rdir.field_0._4_4_,
                              (fVar48 - (float)tray.org.field_0._0_4_) *
                              (float)tray.rdir.field_0._0_4_);
                auVar56._8_4_ =
                     (fVar48 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                auVar56._12_4_ =
                     (fVar48 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
                auVar36._0_8_ =
                     CONCAT44((fVar53 - (float)tray.org.field_0._20_4_) *
                              (float)tray.rdir.field_0._20_4_,
                              (fVar53 - (float)tray.org.field_0._16_4_) *
                              (float)tray.rdir.field_0._16_4_);
                auVar36._8_4_ =
                     (fVar53 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
                auVar36._12_4_ =
                     (fVar53 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
                fVar48 = *(float *)((root.ptr - 0x10) + (long)pRVar18 * 4);
                auVar76._0_8_ =
                     CONCAT44((fVar48 - (float)tray.org.field_0._36_4_) * tray.rdir.field_0._36_4_,
                              (fVar48 - (float)tray.org.field_0._32_4_) * tray.rdir.field_0._32_4_);
                auVar76._8_4_ = (fVar48 - (float)tray.org.field_0._40_4_) * tray.rdir.field_0._40_4_
                ;
                auVar76._12_4_ =
                     (fVar48 - (float)tray.org.field_0._44_4_) * tray.rdir.field_0._44_4_;
                auVar64._0_4_ =
                     (fVar52 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
                auVar64._4_4_ =
                     (fVar52 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
                auVar64._8_4_ =
                     (fVar52 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
                auVar64._12_4_ =
                     (fVar52 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
                auVar68._0_4_ =
                     (fVar54 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
                auVar68._4_4_ =
                     (fVar54 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
                auVar68._8_4_ =
                     (fVar54 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
                auVar68._12_4_ =
                     (fVar54 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
                fVar48 = *(float *)(root.ptr + (long)pRVar18 * 4);
                fVar52 = (fVar48 - (float)tray.org.field_0._32_4_) * tray.rdir.field_0._32_4_;
                fVar53 = (fVar48 - (float)tray.org.field_0._36_4_) * tray.rdir.field_0._36_4_;
                fVar54 = (fVar48 - (float)tray.org.field_0._40_4_) * tray.rdir.field_0._40_4_;
                fVar48 = (fVar48 - (float)tray.org.field_0._44_4_) * tray.rdir.field_0._44_4_;
                auVar71._8_4_ = auVar56._8_4_;
                auVar71._0_8_ = auVar56._0_8_;
                auVar71._12_4_ = auVar56._12_4_;
                auVar63 = minps(auVar71,auVar64);
                auVar86._8_4_ = auVar36._8_4_;
                auVar86._0_8_ = auVar36._0_8_;
                auVar86._12_4_ = auVar36._12_4_;
                auVar84 = minps(auVar86,auVar68);
                auVar63 = maxps(auVar63,auVar84);
                auVar87._8_4_ = auVar76._8_4_;
                auVar87._0_8_ = auVar76._0_8_;
                auVar87._12_4_ = auVar76._12_4_;
                auVar5._4_4_ = fVar53;
                auVar5._0_4_ = fVar52;
                auVar5._8_4_ = fVar54;
                auVar5._12_4_ = fVar48;
                auVar84 = minps(auVar87,auVar5);
                auVar63 = maxps(auVar63,auVar84);
                auVar72._0_8_ = CONCAT44(auVar63._4_4_ * 0.99999964,auVar63._0_4_ * 0.99999964);
                auVar72._8_4_ = auVar63._8_4_ * 0.99999964;
                auVar72._12_4_ = auVar63._12_4_ * 0.99999964;
                auVar84 = maxps(auVar56,auVar64);
                auVar63 = maxps(auVar36,auVar68);
                auVar63 = minps(auVar84,auVar63);
                auVar6._4_4_ = fVar53;
                auVar6._0_4_ = fVar52;
                auVar6._8_4_ = fVar54;
                auVar6._12_4_ = fVar48;
                auVar84 = maxps(auVar76,auVar6);
                auVar84 = minps(auVar63,auVar84);
                auVar37._8_4_ = auVar72._8_4_;
                auVar37._0_8_ = auVar72._0_8_;
                auVar37._12_4_ = auVar72._12_4_;
                auVar63 = maxps(auVar37,(undefined1  [16])tray.tnear.field_0);
                auVar57._0_4_ = auVar84._0_4_ * 1.0000004;
                auVar57._4_4_ = auVar84._4_4_ * 1.0000004;
                auVar57._8_4_ = auVar84._8_4_ * 1.0000004;
                auVar57._12_4_ = auVar84._12_4_ * 1.0000004;
                auVar84 = minps(auVar57,(undefined1  [16])tray.tfar.field_0);
                auVar38._4_4_ = -(uint)(auVar63._4_4_ <= auVar84._4_4_);
                auVar38._0_4_ = -(uint)(auVar63._0_4_ <= auVar84._0_4_);
                auVar38._8_4_ = -(uint)(auVar63._8_4_ <= auVar84._8_4_);
                auVar38._12_4_ = -(uint)(auVar63._12_4_ <= auVar84._12_4_);
              }
              else {
                fVar48 = *(float *)((uVar17 - 0x50) + (long)pRVar18 * 4);
                fVar52 = *(float *)((uVar17 - 0x40) + (long)pRVar18 * 4);
                fVar53 = *(float *)((uVar17 - 0x30) + (long)pRVar18 * 4);
                fVar54 = *(float *)((uVar17 - 0x20) + (long)pRVar18 * 4);
                fVar55 = *(float *)((uVar17 - 0x10) + (long)pRVar18 * 4);
                fVar59 = *(float *)(uVar17 + (long)pRVar18 * 4);
                fVar60 = *(float *)(uVar17 + 0x10 + (long)pRVar18 * 4);
                fVar61 = *(float *)(uVar17 + 0x20 + (long)pRVar18 * 4);
                fVar62 = *(float *)(uVar17 + 0x30 + (long)pRVar18 * 4);
                auVar95._0_4_ =
                     (float)tray.dir.field_0._16_4_ * fVar59 +
                     (float)tray.dir.field_0._32_4_ * fVar62;
                auVar95._4_4_ =
                     (float)tray.dir.field_0._20_4_ * fVar59 +
                     (float)tray.dir.field_0._36_4_ * fVar62;
                auVar95._8_4_ =
                     (float)tray.dir.field_0._24_4_ * fVar59 +
                     (float)tray.dir.field_0._40_4_ * fVar62;
                auVar95._12_4_ =
                     (float)tray.dir.field_0._28_4_ * fVar59 +
                     (float)tray.dir.field_0._44_4_ * fVar62;
                auVar104._0_4_ =
                     fVar48 * (float)tray.dir.field_0._0_4_ +
                     fVar54 * (float)tray.dir.field_0._16_4_ +
                     fVar60 * (float)tray.dir.field_0._32_4_;
                auVar104._4_4_ =
                     fVar48 * (float)tray.dir.field_0._4_4_ +
                     fVar54 * (float)tray.dir.field_0._20_4_ +
                     fVar60 * (float)tray.dir.field_0._36_4_;
                auVar104._8_4_ =
                     fVar48 * (float)tray.dir.field_0._8_4_ +
                     fVar54 * (float)tray.dir.field_0._24_4_ +
                     fVar60 * (float)tray.dir.field_0._40_4_;
                auVar104._12_4_ =
                     fVar48 * (float)tray.dir.field_0._12_4_ +
                     fVar54 * (float)tray.dir.field_0._28_4_ +
                     fVar60 * (float)tray.dir.field_0._44_4_;
                auVar112._0_4_ =
                     fVar52 * (float)tray.dir.field_0._0_4_ +
                     fVar55 * (float)tray.dir.field_0._16_4_ +
                     fVar61 * (float)tray.dir.field_0._32_4_;
                auVar112._4_4_ =
                     fVar52 * (float)tray.dir.field_0._4_4_ +
                     fVar55 * (float)tray.dir.field_0._20_4_ +
                     fVar61 * (float)tray.dir.field_0._36_4_;
                auVar112._8_4_ =
                     fVar52 * (float)tray.dir.field_0._8_4_ +
                     fVar55 * (float)tray.dir.field_0._24_4_ +
                     fVar61 * (float)tray.dir.field_0._40_4_;
                auVar112._12_4_ =
                     fVar52 * (float)tray.dir.field_0._12_4_ +
                     fVar55 * (float)tray.dir.field_0._28_4_ +
                     fVar61 * (float)tray.dir.field_0._44_4_;
                uVar114 = (uint)DAT_01f7b6c0;
                uVar14 = DAT_01f7b6c0._4_4_;
                uVar115 = DAT_01f7b6c0._8_4_;
                uVar116 = DAT_01f7b6c0._12_4_;
                fVar65 = (float)DAT_01f80d30;
                fVar66 = DAT_01f80d30._4_4_;
                fVar67 = DAT_01f80d30._8_4_;
                fVar83 = DAT_01f80d30._12_4_;
                auVar40._4_4_ = -(uint)((float)((uint)auVar104._4_4_ & uVar14) < fVar66);
                auVar40._0_4_ = -(uint)((float)((uint)auVar104._0_4_ & uVar114) < fVar65);
                auVar40._8_4_ = -(uint)((float)((uint)auVar104._8_4_ & uVar115) < fVar67);
                auVar40._12_4_ = -(uint)((float)((uint)auVar104._12_4_ & uVar116) < fVar83);
                auVar84 = blendvps(auVar104,_DAT_01f80d30,auVar40);
                auVar41._4_4_ = -(uint)((float)((uint)auVar112._4_4_ & uVar14) < fVar66);
                auVar41._0_4_ = -(uint)((float)((uint)auVar112._0_4_ & uVar114) < fVar65);
                auVar41._8_4_ = -(uint)((float)((uint)auVar112._8_4_ & uVar115) < fVar67);
                auVar41._12_4_ = -(uint)((float)((uint)auVar112._12_4_ & uVar116) < fVar83);
                auVar102 = blendvps(auVar112,_DAT_01f80d30,auVar41);
                auVar111._0_4_ = (float)tray.dir.field_0._0_4_ * fVar53 + auVar95._0_4_;
                auVar111._4_4_ = (float)tray.dir.field_0._4_4_ * fVar53 + auVar95._4_4_;
                auVar111._8_4_ = (float)tray.dir.field_0._8_4_ * fVar53 + auVar95._8_4_;
                auVar111._12_4_ = (float)tray.dir.field_0._12_4_ * fVar53 + auVar95._12_4_;
                auVar70 = pmovsxbd(_DAT_01f7b6c0,0x1010101);
                auVar42._4_4_ = -(uint)((float)((uint)auVar111._4_4_ & uVar14) < fVar66);
                auVar42._0_4_ = -(uint)((float)((uint)auVar111._0_4_ & uVar114) < fVar65);
                auVar42._8_4_ = -(uint)((float)((uint)auVar111._8_4_ & uVar115) < fVar67);
                auVar42._12_4_ = -(uint)((float)((uint)auVar111._12_4_ & uVar116) < fVar83);
                auVar75 = blendvps(auVar111,_DAT_01f80d30,auVar42);
                auVar63 = rcpps(auVar95,auVar84);
                fVar83 = auVar63._0_4_;
                fVar25 = auVar63._4_4_;
                fVar26 = auVar63._8_4_;
                fVar46 = auVar63._12_4_;
                fVar83 = (1.0 - auVar84._0_4_ * fVar83) * fVar83 + fVar83;
                fVar25 = (1.0 - auVar84._4_4_ * fVar25) * fVar25 + fVar25;
                fVar26 = (1.0 - auVar84._8_4_ * fVar26) * fVar26 + fVar26;
                fVar46 = (1.0 - auVar84._12_4_ * fVar46) * fVar46 + fVar46;
                auVar63 = rcpps(auVar63,auVar102);
                fVar99 = auVar63._0_4_;
                auVar113._0_4_ = auVar102._0_4_ * fVar99;
                fVar105 = auVar63._4_4_;
                auVar113._4_4_ = auVar102._4_4_ * fVar105;
                fVar107 = auVar63._8_4_;
                auVar113._8_4_ = auVar102._8_4_ * fVar107;
                fVar109 = auVar63._12_4_;
                auVar113._12_4_ = auVar102._12_4_ * fVar109;
                fVar99 = (1.0 - auVar113._0_4_) * fVar99 + fVar99;
                fVar105 = (1.0 - auVar113._4_4_) * fVar105 + fVar105;
                fVar107 = (1.0 - auVar113._8_4_) * fVar107 + fVar107;
                fVar109 = (1.0 - auVar113._12_4_) * fVar109 + fVar109;
                auVar63 = rcpps(auVar113,auVar75);
                fVar93 = auVar63._0_4_;
                fVar96 = auVar63._4_4_;
                fVar97 = auVar63._8_4_;
                fVar98 = auVar63._12_4_;
                fVar65 = *(float *)(uVar17 + 0x40 + (long)pRVar18 * 4);
                fVar93 = (1.0 - auVar75._0_4_ * fVar93) * fVar93 + fVar93;
                fVar96 = (1.0 - auVar75._4_4_ * fVar96) * fVar96 + fVar96;
                fVar97 = (1.0 - auVar75._8_4_ * fVar97) * fVar97 + fVar97;
                fVar98 = (1.0 - auVar75._12_4_ * fVar98) * fVar98 + fVar98;
                fVar66 = *(float *)(uVar17 + 0x50 + (long)pRVar18 * 4);
                fVar67 = *(float *)(uVar17 + 0x60 + (long)pRVar18 * 4);
                fVar88 = (fVar48 * (float)tray.org.field_0._0_4_ +
                         fVar54 * (float)tray.org.field_0._16_4_ +
                         fVar60 * (float)tray.org.field_0._32_4_ + fVar65) * -fVar83;
                fVar91 = (fVar48 * (float)tray.org.field_0._4_4_ +
                         fVar54 * (float)tray.org.field_0._20_4_ +
                         fVar60 * (float)tray.org.field_0._36_4_ + fVar65) * -fVar25;
                fVar92 = (fVar48 * (float)tray.org.field_0._8_4_ +
                         fVar54 * (float)tray.org.field_0._24_4_ +
                         fVar60 * (float)tray.org.field_0._40_4_ + fVar65) * -fVar26;
                fVar69 = (fVar48 * (float)tray.org.field_0._12_4_ +
                         fVar54 * (float)tray.org.field_0._28_4_ +
                         fVar60 * (float)tray.org.field_0._44_4_ + fVar65) * -fVar46;
                fVar60 = (fVar52 * (float)tray.org.field_0._0_4_ +
                         fVar55 * (float)tray.org.field_0._16_4_ +
                         fVar61 * (float)tray.org.field_0._32_4_ + fVar66) * -fVar99;
                fVar65 = (fVar52 * (float)tray.org.field_0._4_4_ +
                         fVar55 * (float)tray.org.field_0._20_4_ +
                         fVar61 * (float)tray.org.field_0._36_4_ + fVar66) * -fVar105;
                fVar47 = (fVar52 * (float)tray.org.field_0._8_4_ +
                         fVar55 * (float)tray.org.field_0._24_4_ +
                         fVar61 * (float)tray.org.field_0._40_4_ + fVar66) * -fVar107;
                fVar55 = (fVar52 * (float)tray.org.field_0._12_4_ +
                         fVar55 * (float)tray.org.field_0._28_4_ +
                         fVar61 * (float)tray.org.field_0._44_4_ + fVar66) * -fVar109;
                fVar48 = (fVar53 * (float)tray.org.field_0._0_4_ +
                         fVar59 * (float)tray.org.field_0._16_4_ +
                         fVar62 * (float)tray.org.field_0._32_4_ + fVar67) * -fVar93;
                fVar52 = (fVar53 * (float)tray.org.field_0._4_4_ +
                         fVar59 * (float)tray.org.field_0._20_4_ +
                         fVar62 * (float)tray.org.field_0._36_4_ + fVar67) * -fVar96;
                fVar54 = (fVar53 * (float)tray.org.field_0._8_4_ +
                         fVar59 * (float)tray.org.field_0._24_4_ +
                         fVar62 * (float)tray.org.field_0._40_4_ + fVar67) * -fVar97;
                fVar53 = (fVar53 * (float)tray.org.field_0._12_4_ +
                         fVar59 * (float)tray.org.field_0._28_4_ +
                         fVar62 * (float)tray.org.field_0._44_4_ + fVar67) * -fVar98;
                fVar83 = fVar83 + fVar88;
                fVar25 = fVar25 + fVar91;
                fVar26 = fVar26 + fVar92;
                fVar46 = fVar46 + fVar69;
                fVar99 = fVar99 + fVar60;
                fVar105 = fVar105 + fVar65;
                fVar107 = fVar107 + fVar47;
                fVar109 = fVar109 + fVar55;
                fVar93 = fVar93 + fVar48;
                fVar96 = fVar96 + fVar52;
                fVar97 = fVar97 + fVar54;
                fVar98 = fVar98 + fVar53;
                uVar114 = (uint)((int)fVar83 < (int)fVar88) * (int)fVar83 |
                          (uint)((int)fVar83 >= (int)fVar88) * (int)fVar88;
                uVar14 = (uint)((int)fVar25 < (int)fVar91) * (int)fVar25 |
                         (uint)((int)fVar25 >= (int)fVar91) * (int)fVar91;
                uVar115 = (uint)((int)fVar26 < (int)fVar92) * (int)fVar26 |
                          (uint)((int)fVar26 >= (int)fVar92) * (int)fVar92;
                uVar116 = (uint)((int)fVar46 < (int)fVar69) * (int)fVar46 |
                          (uint)((int)fVar46 >= (int)fVar69) * (int)fVar69;
                uVar73 = (uint)((int)fVar99 < (int)fVar60) * (int)fVar99 |
                         (uint)((int)fVar99 >= (int)fVar60) * (int)fVar60;
                uVar77 = (uint)((int)fVar105 < (int)fVar65) * (int)fVar105 |
                         (uint)((int)fVar105 >= (int)fVar65) * (int)fVar65;
                uVar79 = (uint)((int)fVar107 < (int)fVar47) * (int)fVar107 |
                         (uint)((int)fVar107 >= (int)fVar47) * (int)fVar47;
                uVar81 = (uint)((int)fVar109 < (int)fVar55) * (int)fVar109 |
                         (uint)((int)fVar109 >= (int)fVar55) * (int)fVar55;
                uVar74 = ((int)uVar73 < (int)uVar114) * uVar114 |
                         ((int)uVar73 >= (int)uVar114) * uVar73;
                uVar78 = ((int)uVar77 < (int)uVar14) * uVar14 |
                         ((int)uVar77 >= (int)uVar14) * uVar77;
                uVar80 = ((int)uVar79 < (int)uVar115) * uVar115 |
                         ((int)uVar79 >= (int)uVar115) * uVar79;
                uVar82 = ((int)uVar81 < (int)uVar116) * uVar116 |
                         ((int)uVar81 >= (int)uVar116) * uVar81;
                uVar73 = (uint)((int)fVar93 < (int)fVar48) * (int)fVar93 |
                         (uint)((int)fVar93 >= (int)fVar48) * (int)fVar48;
                uVar77 = (uint)((int)fVar96 < (int)fVar52) * (int)fVar96 |
                         (uint)((int)fVar96 >= (int)fVar52) * (int)fVar52;
                uVar79 = (uint)((int)fVar97 < (int)fVar54) * (int)fVar97 |
                         (uint)((int)fVar97 >= (int)fVar54) * (int)fVar54;
                uVar81 = (uint)((int)fVar98 < (int)fVar53) * (int)fVar98 |
                         (uint)((int)fVar98 >= (int)fVar53) * (int)fVar53;
                uVar114 = (uint)((int)fVar83 < (int)fVar88) * (int)fVar88 |
                          (uint)((int)fVar83 >= (int)fVar88) * (int)fVar83;
                uVar14 = (uint)((int)fVar25 < (int)fVar91) * (int)fVar91 |
                         (uint)((int)fVar25 >= (int)fVar91) * (int)fVar25;
                uVar115 = (uint)((int)fVar26 < (int)fVar92) * (int)fVar92 |
                          (uint)((int)fVar26 >= (int)fVar92) * (int)fVar26;
                uVar116 = (uint)((int)fVar46 < (int)fVar69) * (int)fVar69 |
                          (uint)((int)fVar46 >= (int)fVar69) * (int)fVar46;
                uVar100 = (uint)((int)fVar99 < (int)fVar60) * (int)fVar60 |
                          (uint)((int)fVar99 >= (int)fVar60) * (int)fVar99;
                uVar106 = (uint)((int)fVar105 < (int)fVar65) * (int)fVar65 |
                          (uint)((int)fVar105 >= (int)fVar65) * (int)fVar105;
                uVar108 = (uint)((int)fVar107 < (int)fVar47) * (int)fVar47 |
                          (uint)((int)fVar107 >= (int)fVar47) * (int)fVar107;
                uVar110 = (uint)((int)fVar109 < (int)fVar55) * (int)fVar55 |
                          (uint)((int)fVar109 >= (int)fVar55) * (int)fVar109;
                uVar100 = ((int)uVar114 < (int)uVar100) * uVar114 |
                          ((int)uVar114 >= (int)uVar100) * uVar100;
                uVar106 = ((int)uVar14 < (int)uVar106) * uVar14 |
                          ((int)uVar14 >= (int)uVar106) * uVar106;
                uVar108 = ((int)uVar115 < (int)uVar108) * uVar115 |
                          ((int)uVar115 >= (int)uVar108) * uVar108;
                uVar110 = ((int)uVar116 < (int)uVar110) * uVar116 |
                          ((int)uVar116 >= (int)uVar110) * uVar110;
                uVar114 = (uint)((int)fVar93 < (int)fVar48) * (int)fVar48 |
                          (uint)((int)fVar93 >= (int)fVar48) * (int)fVar93;
                uVar14 = (uint)((int)fVar96 < (int)fVar52) * (int)fVar52 |
                         (uint)((int)fVar96 >= (int)fVar52) * (int)fVar96;
                uVar115 = (uint)((int)fVar97 < (int)fVar54) * (int)fVar54 |
                          (uint)((int)fVar97 >= (int)fVar54) * (int)fVar97;
                uVar116 = (uint)((int)fVar98 < (int)fVar53) * (int)fVar53 |
                          (uint)((int)fVar98 >= (int)fVar53) * (int)fVar98;
                auVar72._0_4_ =
                     (float)(((int)uVar73 < (int)uVar74) * uVar74 |
                            ((int)uVar73 >= (int)uVar74) * uVar73) * 0.99999964;
                auVar72._4_4_ =
                     (float)(((int)uVar77 < (int)uVar78) * uVar78 |
                            ((int)uVar77 >= (int)uVar78) * uVar77) * 0.99999964;
                auVar72._8_4_ =
                     (float)(((int)uVar79 < (int)uVar80) * uVar80 |
                            ((int)uVar79 >= (int)uVar80) * uVar79) * 0.99999964;
                auVar72._12_4_ =
                     (float)(((int)uVar81 < (int)uVar82) * uVar82 |
                            ((int)uVar81 >= (int)uVar82) * uVar81) * 0.99999964;
                fVar48 = (float)(((int)uVar100 < (int)uVar114) * uVar100 |
                                ((int)uVar100 >= (int)uVar114) * uVar114) * 1.0000004;
                fVar52 = (float)(((int)uVar106 < (int)uVar14) * uVar106 |
                                ((int)uVar106 >= (int)uVar14) * uVar14) * 1.0000004;
                fVar53 = (float)(((int)uVar108 < (int)uVar115) * uVar108 |
                                ((int)uVar108 >= (int)uVar115) * uVar115) * 1.0000004;
                fVar54 = (float)(((int)uVar110 < (int)uVar116) * uVar110 |
                                ((int)uVar110 >= (int)uVar116) * uVar116) * 1.0000004;
                auVar38._4_4_ =
                     -(uint)((float)((uint)(tray.tnear.field_0.i[1] < (int)auVar72._4_4_) *
                                     (int)auVar72._4_4_ |
                                    (uint)(tray.tnear.field_0.i[1] >= (int)auVar72._4_4_) *
                                    tray.tnear.field_0.i[1]) <=
                            (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar52) *
                                    tray.tfar.field_0.i[1] |
                                   (uint)(tray.tfar.field_0.i[1] >= (int)fVar52) * (int)fVar52));
                auVar38._0_4_ =
                     -(uint)((float)((uint)(tray.tnear.field_0.i[0] < (int)auVar72._0_4_) *
                                     (int)auVar72._0_4_ |
                                    (uint)(tray.tnear.field_0.i[0] >= (int)auVar72._0_4_) *
                                    tray.tnear.field_0.i[0]) <=
                            (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar48) *
                                    tray.tfar.field_0.i[0] |
                                   (uint)(tray.tfar.field_0.i[0] >= (int)fVar48) * (int)fVar48));
                auVar38._8_4_ =
                     -(uint)((float)((uint)(tray.tnear.field_0.i[2] < (int)auVar72._8_4_) *
                                     (int)auVar72._8_4_ |
                                    (uint)(tray.tnear.field_0.i[2] >= (int)auVar72._8_4_) *
                                    tray.tnear.field_0.i[2]) <=
                            (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar53) *
                                    tray.tfar.field_0.i[2] |
                                   (uint)(tray.tfar.field_0.i[2] >= (int)fVar53) * (int)fVar53));
                auVar38._12_4_ =
                     -(uint)((float)((uint)(tray.tnear.field_0.i[3] < (int)auVar72._12_4_) *
                                     (int)auVar72._12_4_ |
                                    (uint)(tray.tnear.field_0.i[3] >= (int)auVar72._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                            (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar54) *
                                    tray.tfar.field_0.i[3] |
                                   (uint)(tray.tfar.field_0.i[3] >= (int)fVar54) * (int)fVar54));
                aVar103 = _DAT_01f7a9f0;
              }
              if (((auVar70 & auVar38) != (undefined1  [16])0x0) &&
                 (auVar39._0_4_ = auVar38._0_4_ << 0x1f, auVar39._4_4_ = auVar38._4_4_ << 0x1f,
                 auVar39._8_4_ = auVar38._8_4_ << 0x1f, auVar39._12_4_ = auVar38._12_4_ << 0x1f,
                 aVar58.v = (__m128)blendvps(aVar103.v,auVar72,auVar39), sVar19 = sVar2, sVar20 != 8
                 )) {
                pNVar23->ptr = sVar20;
                pNVar23 = pNVar23 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21->v = aVar51;
                paVar21 = paVar21 + 1;
              }
              aVar51 = aVar58;
              pRVar18 = (RayQueryContext *)((long)&pRVar18->scene + 1);
              sVar20 = sVar19;
              aVar58 = aVar51;
            } while (pRVar18 != (RayQueryContext *)&DAT_00000020);
            aVar51 = aVar103;
            if (sVar19 == 8) goto LAB_0023f2f4;
            auVar43._4_4_ = -(uint)(aVar58.v[1] < tray.tfar.field_0.v[1]);
            auVar43._0_4_ = -(uint)(aVar58.v[0] < tray.tfar.field_0.v[0]);
            auVar43._8_4_ = -(uint)(aVar58.v[2] < tray.tfar.field_0.v[2]);
            auVar43._12_4_ = -(uint)(aVar58.v[3] < tray.tfar.field_0.v[3]);
            uVar15 = movmskps((int)root.ptr,auVar43);
            root.ptr = sVar19;
            uVar114 = POPCOUNT(uVar15);
          } while ((byte)uVar16 < (byte)POPCOUNT(uVar15));
          pNVar23->ptr = sVar19;
          pNVar23 = pNVar23 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar21->v = aVar58;
          paVar21 = paVar21 + 1;
        }
        else {
          do {
            sVar20 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> sVar20 & 1) == 0; sVar20 = sVar20 + 1) {
              }
            }
            pRVar18 = context;
            bVar12 = occluded1(This,bvh,root,sVar20,&pre,ray,&tray,context);
            if (bVar12) {
              terminated.field_0.i[sVar20] = -1;
            }
            uVar17 = uVar17 & uVar17 - 1;
          } while (uVar17 != 0);
          iVar24 = movmskps(0,(undefined1  [16])terminated.field_0);
          uVar13 = 3;
          if (iVar24 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f7aa00,
                          (undefined1  [16])terminated.field_0);
            uVar13 = 2;
          }
          auVar70 = pmovsxbd(auVar70,0x1010101);
          aVar51 = _DAT_01f7a9f0;
          uVar114 = uVar13;
          if (uVar16 < uVar14) goto LAB_0023ee95;
        }
LAB_0023f2f4:
      } while (uVar13 != 3);
LAB_0023f4ee:
      auVar45._0_4_ = auVar49._0_4_ & terminated.field_0.i[0];
      auVar45._4_4_ = auVar49._4_4_ & terminated.field_0.i[1];
      auVar45._8_4_ = auVar49._8_4_ & terminated.field_0.i[2];
      auVar45._12_4_ = auVar49._12_4_ & terminated.field_0.i[3];
      auVar70 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa00,auVar45);
      *(undefined1 (*) [16])(ray + 0x80) = auVar70;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }